

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O0

void CVodeFree(void **cvode_mem)

{
  long *in_RDI;
  void *unaff_retaddr;
  CVodeMem cv_mem;
  CVodeProjMem *in_stack_ffffffffffffffe8;
  CVodeMem cv_mem_00;
  
  if (*in_RDI != 0) {
    cv_mem_00 = (CVodeMem)*in_RDI;
    cvFreeVectors(cv_mem_00);
    if (cv_mem_00->ownNLS != 0) {
      SUNNonlinSolFree(cv_mem_00->NLS);
      cv_mem_00->ownNLS = 0;
      cv_mem_00->NLS = (SUNNonlinearSolver)0x0;
    }
    CVodeQuadFree(cv_mem_00);
    CVodeSensFree(cv_mem_00);
    CVodeQuadSensFree(cv_mem_00);
    CVodeAdjFree(unaff_retaddr);
    if (cv_mem_00->cv_lfree != (_func_int_CVodeMemRec_ptr *)0x0) {
      (*cv_mem_00->cv_lfree)(cv_mem_00);
    }
    if (0 < cv_mem_00->cv_nrtfn) {
      free(cv_mem_00->cv_glo);
      cv_mem_00->cv_glo = (sunrealtype *)0x0;
      free(cv_mem_00->cv_ghi);
      cv_mem_00->cv_ghi = (sunrealtype *)0x0;
      free(cv_mem_00->cv_grout);
      cv_mem_00->cv_grout = (sunrealtype *)0x0;
      free(cv_mem_00->cv_iroots);
      cv_mem_00->cv_iroots = (int *)0x0;
      free(cv_mem_00->cv_rootdir);
      cv_mem_00->cv_rootdir = (int *)0x0;
      free(cv_mem_00->cv_gactive);
      cv_mem_00->cv_gactive = (int *)0x0;
    }
    free(cv_mem_00->cv_cvals);
    cv_mem_00->cv_cvals = (sunrealtype *)0x0;
    free(cv_mem_00->cv_Xvecs);
    cv_mem_00->cv_Xvecs = (N_Vector *)0x0;
    free(cv_mem_00->cv_Zvecs);
    cv_mem_00->cv_Zvecs = (N_Vector *)0x0;
    if (cv_mem_00->proj_mem != (CVodeProjMem)0x0) {
      cvProjFree(in_stack_ffffffffffffffe8);
    }
    free((void *)*in_RDI);
    *in_RDI = 0;
  }
  return;
}

Assistant:

void CVodeFree(void** cvode_mem)
{
  CVodeMem cv_mem;

  if (*cvode_mem == NULL) { return; }

  cv_mem = (CVodeMem)(*cvode_mem);

  cvFreeVectors(cv_mem);

  /* if CVODE created the nonlinear solver object then free it */
  if (cv_mem->ownNLS)
  {
    SUNNonlinSolFree(cv_mem->NLS);
    cv_mem->ownNLS = SUNFALSE;
    cv_mem->NLS    = NULL;
  }

  CVodeQuadFree(cv_mem);

  CVodeSensFree(cv_mem);

  CVodeQuadSensFree(cv_mem);

  CVodeAdjFree(cv_mem);

  if (cv_mem->cv_lfree != NULL) { cv_mem->cv_lfree(cv_mem); }

  if (cv_mem->cv_nrtfn > 0)
  {
    free(cv_mem->cv_glo);
    cv_mem->cv_glo = NULL;
    free(cv_mem->cv_ghi);
    cv_mem->cv_ghi = NULL;
    free(cv_mem->cv_grout);
    cv_mem->cv_grout = NULL;
    free(cv_mem->cv_iroots);
    cv_mem->cv_iroots = NULL;
    free(cv_mem->cv_rootdir);
    cv_mem->cv_rootdir = NULL;
    free(cv_mem->cv_gactive);
    cv_mem->cv_gactive = NULL;
  }

  free(cv_mem->cv_cvals);
  cv_mem->cv_cvals = NULL;
  free(cv_mem->cv_Xvecs);
  cv_mem->cv_Xvecs = NULL;
  free(cv_mem->cv_Zvecs);
  cv_mem->cv_Zvecs = NULL;

  if (cv_mem->proj_mem) { cvProjFree(&(cv_mem->proj_mem)); }

  free(*cvode_mem);
  *cvode_mem = NULL;
}